

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeparser.cpp
# Opt level: O2

string * __thiscall
stackjit::ByteCodeParser::peekNextToken_abi_cxx11_
          (string *__return_storage_ptr__,ByteCodeParser *this)

{
  pointer pbVar1;
  ulong uVar2;
  runtime_error *this_00;
  
  pbVar1 = (this->mTokens).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar2 = this->mTokenIndex + 1;
  if (uVar2 <= (ulong)((long)(this->mTokens).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5)) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)(pbVar1 + uVar2));
    return __return_storage_ptr__;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Reached end of tokens.");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::string ByteCodeParser::peekNextToken() {
		if (mTokens.size() >= mTokenIndex + 1) {
			return mTokens[mTokenIndex + 1];
		} else {
			throw std::runtime_error("Reached end of tokens.");
		}
	}